

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O1

void fl_init_symbols(void)

{
  if (fl_init_symbols()::beenhere != '\0') {
    return;
  }
  fl_init_symbols()::beenhere = 1;
  symbnumb = 0;
  fl_add_symbol("",draw_arrow1,1);
  fl_add_symbol("->",draw_arrow1,1);
  fl_add_symbol(">",draw_arrow2,1);
  fl_add_symbol(">>",draw_arrow3,1);
  fl_add_symbol(">|",draw_arrowbar,1);
  fl_add_symbol(">[]",draw_arrowbox,1);
  fl_add_symbol("|>",draw_bararrow,1);
  fl_add_symbol("<-",draw_arrow01,1);
  fl_add_symbol("<",draw_arrow02,1);
  fl_add_symbol("<<",draw_arrow03,1);
  fl_add_symbol("|<",draw_0arrowbar,1);
  fl_add_symbol("[]<",draw_0arrowbox,1);
  fl_add_symbol("<|",draw_0bararrow,1);
  fl_add_symbol("<->",draw_doublearrow,1);
  fl_add_symbol("-->",draw_arrow,1);
  fl_add_symbol("+",draw_plus,1);
  fl_add_symbol("->|",draw_arrow1bar,1);
  fl_add_symbol("arrow",draw_arrow,1);
  fl_add_symbol("returnarrow",(_func_void_Fl_Color *)0x0,3);
  fl_add_symbol("square",draw_square,1);
  fl_add_symbol("circle",draw_circle,1);
  fl_add_symbol("line",draw_line,1);
  fl_add_symbol("plus",draw_plus,1);
  fl_add_symbol("menu",draw_menu,1);
  fl_add_symbol("UpArrow",draw_uparrow,1);
  fl_add_symbol("DnArrow",draw_downarrow,1);
  fl_add_symbol("||",draw_doublebar,1);
  fl_add_symbol("search",draw_search,1);
  fl_add_symbol("FLTK",draw_fltk,1);
  fl_add_symbol("filenew",draw_filenew,1);
  fl_add_symbol("fileopen",draw_fileopen,1);
  fl_add_symbol("filesave",draw_filesave,1);
  fl_add_symbol("filesaveas",draw_filesaveas,1);
  fl_add_symbol("fileprint",draw_fileprint,1);
  fl_add_symbol("refresh",draw_refresh,1);
  fl_add_symbol("reload",draw_reload,1);
  fl_add_symbol("undo",draw_undo,1);
  fl_add_symbol("redo",draw_redo,1);
  return;
}

Assistant:

static void fl_init_symbols(void) {
  static char beenhere;
  if (beenhere) return;
  beenhere = 1;
  symbnumb = 0;

  fl_add_symbol("",		draw_arrow1,		1);
  fl_add_symbol("->",		draw_arrow1,		1);
  fl_add_symbol(">",		draw_arrow2,		1);
  fl_add_symbol(">>",		draw_arrow3,		1);
  fl_add_symbol(">|",		draw_arrowbar,		1);
  fl_add_symbol(">[]",		draw_arrowbox,		1);
  fl_add_symbol("|>",		draw_bararrow,		1);
  fl_add_symbol("<-",		draw_arrow01,		1);
  fl_add_symbol("<",		draw_arrow02,		1);
  fl_add_symbol("<<",		draw_arrow03,		1);
  fl_add_symbol("|<",		draw_0arrowbar,		1);
  fl_add_symbol("[]<",		draw_0arrowbox,		1);
  fl_add_symbol("<|",		draw_0bararrow,		1);
  fl_add_symbol("<->",		draw_doublearrow,	1);
  fl_add_symbol("-->",		draw_arrow,		1);
  fl_add_symbol("+",		draw_plus,		1);
  fl_add_symbol("->|",		draw_arrow1bar,		1);
  fl_add_symbol("arrow",	draw_arrow,		1);
  fl_add_symbol("returnarrow",	0,			3);
  fl_add_symbol("square",	draw_square,		1);
  fl_add_symbol("circle",	draw_circle,		1);
  fl_add_symbol("line",		draw_line,		1);
  fl_add_symbol("plus",		draw_plus,		1);
  fl_add_symbol("menu",		draw_menu,		1);
  fl_add_symbol("UpArrow",	draw_uparrow,		1);
  fl_add_symbol("DnArrow",	draw_downarrow,		1);
  fl_add_symbol("||",		draw_doublebar,		1);
  fl_add_symbol("search",       draw_search,            1);
  fl_add_symbol("FLTK",         draw_fltk,              1);

  fl_add_symbol("filenew",      draw_filenew,           1);
  fl_add_symbol("fileopen",     draw_fileopen,          1);
  fl_add_symbol("filesave",     draw_filesave,          1);
  fl_add_symbol("filesaveas",   draw_filesaveas,        1);
  fl_add_symbol("fileprint",    draw_fileprint,         1);

  fl_add_symbol("refresh",      draw_refresh,           1);
  fl_add_symbol("reload",       draw_reload,            1);
  fl_add_symbol("undo",         draw_undo,              1);
  fl_add_symbol("redo",         draw_redo,              1);

//  fl_add_symbol("file",      draw_file,           1);
}